

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psft.c
# Opt level: O0

FT_Fast cf2_initLocalRegionBuffer(PS_Decoder *decoder,FT_Fast subrNum,CF2_Buffer buf)

{
  uint uVar1;
  int local_3c;
  FT_Byte *local_38;
  FT_UFast idx;
  CF2_Buffer buf_local;
  FT_Fast subrNum_local;
  PS_Decoder *decoder_local;
  
  memset(buf,0,0x20);
  uVar1 = subrNum + decoder->locals_bias;
  if (uVar1 < decoder->num_locals) {
    buf->start = decoder->locals[uVar1];
    if ((decoder->builder).is_t1 == '\0') {
      buf->end = decoder->locals[uVar1 + 1];
    }
    else if (decoder->locals_len == (FT_UInt *)0x0) {
      if (decoder->lenIV < 0) {
        local_3c = 0;
      }
      else {
        local_3c = decoder->lenIV;
      }
      buf->start = buf->start + local_3c;
      buf->end = decoder->locals[uVar1 + 1];
    }
    else {
      if (buf->start == (FT_Byte *)0x0) {
        local_38 = (FT_Byte *)0x0;
      }
      else {
        local_38 = buf->start + decoder->locals_len[uVar1];
      }
      buf->end = local_38;
    }
    buf->ptr = buf->start;
    decoder_local._4_4_ = 0;
  }
  else {
    decoder_local._4_4_ = 1;
  }
  return decoder_local._4_4_;
}

Assistant:

FT_LOCAL_DEF( CF2_Int )
  cf2_initLocalRegionBuffer( PS_Decoder*  decoder,
                             CF2_Int      subrNum,
                             CF2_Buffer   buf )
  {
    CF2_UInt  idx;


    FT_ASSERT( decoder );

    FT_ZERO( buf );

    idx = (CF2_UInt)( subrNum + decoder->locals_bias );
    if ( idx >= decoder->num_locals )
      return TRUE;     /* error */

    FT_ASSERT( decoder->locals );

    buf->start = decoder->locals[idx];

    if ( decoder->builder.is_t1 )
    {
      /* The Type 1 driver stores subroutines without the seed bytes. */
      /* The CID driver stores subroutines with seed bytes.  This     */
      /* case is taken care of when decoder->subrs_len == 0.          */
      if ( decoder->locals_len )
        buf->end = FT_OFFSET( buf->start, decoder->locals_len[idx] );
      else
      {
        /* We are using subroutines from a CID font.  We must adjust */
        /* for the seed bytes.                                       */
        buf->start += ( decoder->lenIV >= 0 ? decoder->lenIV : 0 );
        buf->end    = decoder->locals[idx + 1];
      }

      if ( !buf->start )
      {
        FT_ERROR(( "cf2_initLocalRegionBuffer (Type 1 mode):"
                   " invoking empty subrs\n" ));
      }
    }
    else
    {
      buf->end = decoder->locals[idx + 1];
    }

    buf->ptr = buf->start;

    return FALSE;      /* success */
  }